

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O0

QSize __thiscall QPushButton::sizeHint(QPushButton *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  QPushButtonPrivate *pQVar4;
  QDialogButtonBox *pQVar5;
  QStyle *pQVar6;
  int *piVar7;
  QMenu *pQVar8;
  long *in_RDI;
  long in_FS_OFFSET;
  bool empty;
  int iw;
  bool showButtonBoxIcons;
  int w;
  QPushButtonPrivate *d;
  char16_t *str;
  QSize sz;
  QFontMetrics fm;
  QString s;
  int ih;
  int h;
  QStyleOptionButton opt;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  QStyleOptionButton *in_stack_fffffffffffffe90;
  QAbstractButton *in_stack_fffffffffffffe98;
  QSize *in_stack_fffffffffffffea0;
  QSize *s_00;
  undefined1 in_stack_fffffffffffffea8;
  undefined1 uVar9;
  byte bVar10;
  undefined1 uVar11;
  uint in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb8;
  uint uVar12;
  undefined4 in_stack_fffffffffffffebc;
  int local_13c;
  undefined1 local_10c [8];
  QSize local_104;
  int local_f4;
  undefined1 *local_f0;
  undefined1 *local_e8;
  QArrayDataPointer<char16_t> local_e0 [2];
  undefined1 *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  int local_94;
  QIcon local_90;
  int local_84;
  QSize local_80;
  undefined1 local_78 [16];
  QSize aQStack_68 [12];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QPushButton *)0x6655c0);
  bVar1 = QSize::isValid(in_stack_fffffffffffffea0);
  if (bVar1) {
    in_stack_fffffffffffffeac = (uint)((byte)pQVar4->field_0x2c8 >> 6 & 1);
    bVar1 = autoDefault((QPushButton *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
                       );
    if (in_stack_fffffffffffffeac == bVar1) {
      local_80 = (pQVar4->super_QAbstractButtonPrivate).sizeHint;
      goto LAB_00665a60;
    }
  }
  bVar1 = autoDefault((QPushButton *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  pQVar4->field_0x2c8 = pQVar4->field_0x2c8 & 0xbf | bVar1 << 6;
  QWidget::ensurePolished((QWidget *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
  local_13c = 0;
  local_84 = 0;
  memset(local_78,0xaa,0x70);
  QStyleOptionButton::QStyleOptionButton((QStyleOptionButton *)0x665694);
  (**(code **)(*in_RDI + 0x1b8))(in_RDI,local_78);
  QWidget::parentWidget((QWidget *)0x6656b4);
  pQVar5 = qobject_cast<QDialogButtonBox*>((QObject *)0x6656bc);
  bVar10 = false;
  if (pQVar5 != (QDialogButtonBox *)0x0) {
    pQVar6 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
                           );
    iVar3 = (**(code **)(*(long *)pQVar6 + 0xf0))(pQVar6,0x47,0,in_RDI);
    bVar10 = iVar3 != 0;
  }
  uVar11 = bVar10;
  QAbstractButton::icon(in_stack_fffffffffffffe98);
  bVar2 = QIcon::isNull();
  if ((bVar2 & 1) == 0) {
    bVar10 = true;
  }
  uVar9 = bVar10;
  QIcon::~QIcon(&local_90);
  if ((bVar10 & 1) != 0) {
    local_94 = QSize::height((QSize *)0x66576d);
    local_13c = QSize::width((QSize *)0x665785);
    local_13c = local_13c + 4;
    piVar7 = qMax<int>(&local_84,&local_94);
    local_84 = *piVar7;
  }
  local_b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  local_a0 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractButton::text(in_stack_fffffffffffffe98);
  bVar1 = QString::isEmpty((QString *)0x665802);
  uVar12 = (uint)bVar1 << 0x18;
  if (bVar1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_e0,(Data *)0x0,L"XXXX",4);
    QString::QString((QString *)in_stack_fffffffffffffe90,
                     (DataPointer *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    QString::operator=((QString *)in_stack_fffffffffffffe90,
                       (QString *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    QString::~QString((QString *)0x665888);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffe90);
  }
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  QWidget::fontMetrics((QWidget *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  local_f0 = &DAT_aaaaaaaaaaaaaaaa;
  local_f0 = (undefined1 *)
             QFontMetrics::size((int)&local_e8,(QString *)0x800,(int)&local_b0,(int *)0x0);
  if (((uVar12 & 0x1000000) == 0) || (local_13c == 0)) {
    QSize::width((QSize *)0x665909);
  }
  if (((uVar12 & 0x1000000) == 0) || (local_84 == 0)) {
    local_f4 = QSize::height((QSize *)0x66592f);
    piVar7 = qMax<int>(&local_84,&local_f4);
    local_84 = *piVar7;
  }
  s_00 = aQStack_68;
  QSize::QSize((QSize *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
               in_stack_fffffffffffffe88);
  QRect::setSize((QRect *)CONCAT44(in_stack_fffffffffffffeac,
                                   CONCAT13(uVar11,CONCAT12(uVar9,CONCAT11(bVar10,
                                                  in_stack_fffffffffffffea8)))),s_00);
  pQVar8 = menu((QPushButton *)in_stack_fffffffffffffe90);
  if (pQVar8 != (QMenu *)0x0) {
    pQVar6 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
                           );
    (**(code **)(*(long *)pQVar6 + 0xe0))(pQVar6,2,local_78,in_RDI);
  }
  pQVar6 = QWidget::style((QWidget *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  QSize::QSize((QSize *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,
               in_stack_fffffffffffffe88);
  local_104 = (QSize)(**(code **)(*(long *)pQVar6 + 0xe8))(pQVar6,0,local_78,local_10c,in_RDI);
  (pQVar4->super_QAbstractButtonPrivate).sizeHint = local_104;
  local_80 = (pQVar4->super_QAbstractButtonPrivate).sizeHint;
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_e8);
  QString::~QString((QString *)0x665a53);
  QStyleOptionButton::~QStyleOptionButton(in_stack_fffffffffffffe90);
LAB_00665a60:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_80;
}

Assistant:

QSize QPushButton::sizeHint() const
{
    Q_D(const QPushButton);
    if (d->sizeHint.isValid() && d->lastAutoDefault == autoDefault())
        return d->sizeHint;
    d->lastAutoDefault = autoDefault();
    ensurePolished();

    int w = 0, h = 0;

    QStyleOptionButton opt;
    initStyleOption(&opt);

    // calculate contents size...
#if !defined(QT_NO_ICON) && QT_CONFIG(dialogbuttonbox)
    bool showButtonBoxIcons = qobject_cast<QDialogButtonBox*>(parentWidget())
                          && style()->styleHint(QStyle::SH_DialogButtonBox_ButtonsHaveIcons, nullptr, this);

    if (!icon().isNull() || showButtonBoxIcons) {
        int ih = opt.iconSize.height();
        int iw = opt.iconSize.width() + 4;
        w += iw;
        h = qMax(h, ih);
    }
#endif
    QString s(text());
    bool empty = s.isEmpty();
    if (empty)
        s = QStringLiteral("XXXX");
    QFontMetrics fm = fontMetrics();
    QSize sz = fm.size(Qt::TextShowMnemonic, s);
    if (!empty || !w)
        w += sz.width();
    if (!empty || !h)
        h = qMax(h, sz.height());
    opt.rect.setSize(QSize(w, h)); // PM_MenuButtonIndicator depends on the height
#if QT_CONFIG(menu)
    if (menu())
        w += style()->pixelMetric(QStyle::PM_MenuButtonIndicator, &opt, this);
#endif
    d->sizeHint = style()->sizeFromContents(QStyle::CT_PushButton, &opt, QSize(w, h), this);
    return d->sizeHint;
}